

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O3

void lts2::PerformTVL1OnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float lambda,float patchMean)

{
  LBDOperator *LBD_00;
  int iVar1;
  _InputArray *p_Var2;
  undefined8 uVar3;
  int iVar4;
  Mat *pMVar5;
  int iVar6;
  Size patchSize_00;
  int iVar7;
  int iVar8;
  float patchMean_00;
  Rect ROI;
  Mat inputPatch;
  Mat resultPatch;
  Mat patchOnes;
  Mat ocount;
  Mat target;
  Mat freak;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  Mat *local_440;
  Mat *local_438;
  _OutputArray local_430;
  _InputArray local_418;
  LBDOperator *local_400;
  Size *local_3f8;
  _InputArray local_3f0 [4];
  Size local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined1 local_378 [16];
  undefined1 local_368 [6] [16];
  Mat local_308 [96];
  Mat local_2a8 [152];
  Mat local_210 [96];
  Mat local_1b0 [96];
  _InputArray local_150 [4];
  double local_f0 [12];
  Mat local_90 [96];
  
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_380 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    patchSize_00 = (Size)result;
    cv::Mat::create(result,&local_380,5);
    local_150[0].obj = local_378;
    local_368[0] = (undefined1  [16])0x0;
    local_378 = (undefined1  [16])0x0;
    local_150[0].flags = -0x3efdfffa;
    local_150[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,local_150);
    local_388 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    local_368[0] = (undefined1  [16])0x0;
    local_378 = (undefined1  [16])0x0;
    local_438 = anImage;
    cv::Mat::Mat((Mat *)local_150,&local_388,5,local_378);
    local_390 = *patchSize;
    cv::Mat::ones(local_378,&local_390,5);
    local_440 = result;
    local_400 = LBD;
    local_3f8 = patchSize;
    cv::Mat::Mat(local_1b0);
    (**(code **)(*(long *)local_378._0_8_ + 0x18))(local_378._0_8_,local_378,local_1b0,0xffffffff);
    cv::Mat::~Mat(local_2a8);
    cv::Mat::~Mat(local_308);
    cv::Mat::~Mat((Mat *)local_368);
    cv::Mat::Mat((Mat *)local_378);
    cv::Mat::Mat(local_90);
    cv::Mat::Mat(local_210);
    LBD_00 = local_400;
    iVar1 = patchOffset->x;
    if (iVar1 < 2) {
      iVar1 = 1;
    }
    iVar7 = 1;
    if (1 < patchOffset->y) {
      iVar7 = patchOffset->y;
    }
    patchOffset->x = iVar1;
    patchOffset->y = iVar7;
    iVar6 = *(int *)(local_438 + 8);
    if (0 < iVar6) {
      iVar4 = *(int *)(local_438 + 0xc);
      iVar8 = 0;
      pMVar5 = local_438;
      do {
        if (0 < iVar4) {
          iVar7 = 0;
          do {
            local_448 = local_3f8->width;
            local_444 = local_3f8->height;
            local_450 = iVar7;
            local_44c = iVar8;
            if ((local_444 + iVar8 <= *(int *)(pMVar5 + 8)) && (local_448 + iVar7 <= iVar4)) {
              cv::Mat::Mat((Mat *)local_f0,pMVar5,(Rect_ *)&local_450);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x2010000;
              local_3f0[0].obj = local_378;
              cv::Mat::copyTo((_OutputArray *)local_f0);
              cv::Mat::~Mat((Mat *)local_f0);
              patchMean_00 = patchMean;
              if (patchMean < 0.0) {
                local_3f0[0].sz.width = 0;
                local_3f0[0].sz.height = 0;
                local_3f0[0].flags = 0x1010000;
                local_3f0[0].obj = local_378;
                cv::noArray();
                cv::mean((_InputArray *)local_f0,local_3f0);
                patchMean_00 = (float)local_f0[0];
              }
              (*(LBD_00->super_LinearOperator)._vptr_LinearOperator[2])(LBD_00,local_378,local_90);
              RealReconstructionWithTVL1
                        (local_210,LBD_00,local_90,iterations,lambda,patchSize_00,patchMean_00);
              cv::Mat::Mat((Mat *)local_f0,local_440,(Rect_ *)&local_450);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_418.sz.width = 0;
              local_418.sz.height = 0;
              local_418.flags = 0x1010000;
              local_418.obj = local_210;
              local_430.super__InputArray.sz.width = 0;
              local_430.super__InputArray.sz.height = 0;
              local_430.super__InputArray.flags = -0x3dff0000;
              local_430.super__InputArray.obj = (_InputArray *)local_f0;
              local_3f0[0].obj = (_InputArray *)local_f0;
              p_Var2 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_418,&local_430,p_Var2,-1);
              cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_150,(Rect_ *)&local_450);
              cv::Mat::operator=((Mat *)local_f0,(Mat *)local_3f0);
              cv::Mat::~Mat((Mat *)local_3f0);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_418.sz.width = 0;
              local_418.sz.height = 0;
              local_418.flags = 0x1010000;
              local_418.obj = local_1b0;
              local_430.super__InputArray.sz.width = 0;
              local_430.super__InputArray.sz.height = 0;
              local_430.super__InputArray.flags = -0x3dff0000;
              local_430.super__InputArray.obj = (_InputArray *)local_f0;
              local_3f0[0].obj = (_InputArray *)local_f0;
              p_Var2 = (_InputArray *)cv::noArray();
              patchSize_00.width = -1;
              patchSize_00.height = 0;
              cv::add(local_3f0,&local_418,&local_430,p_Var2,-1);
              cv::Mat::~Mat((Mat *)local_f0);
              iVar1 = patchOffset->x;
              iVar4 = *(int *)(local_438 + 0xc);
              pMVar5 = local_438;
            }
            iVar7 = iVar7 + iVar1;
          } while (iVar7 < iVar4);
          iVar7 = patchOffset->y;
          iVar6 = *(int *)(pMVar5 + 8);
        }
        iVar8 = iVar8 + iVar7;
      } while (iVar8 < iVar6);
    }
    finalize(local_440,(Mat *)local_150[0].sz);
    cv::Mat::~Mat(local_210);
    cv::Mat::~Mat(local_90);
    cv::Mat::~Mat((Mat *)local_378);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat((Mat *)local_150);
    return;
  }
  local_378._8_8_ = local_378._0_8_;
  local_378._0_8_ = local_368;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_378,"anImage.type() == CV_32F && anImage.channels() == 1","");
  uVar3 = cv::error(-0xd7,(string *)local_378,"PerformTVL1OnImage",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x1cf);
  if ((undefined1 (*) [16])local_378._0_8_ != local_368) {
    operator_delete((void *)local_378._0_8_,local_368[0]._0_8_ + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void lts2::PerformTVL1OnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float lambda, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);
      lts2::RealReconstructionWithTVL1(resultPatch, LBD, freak, iterations,
                                      lambda, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}